

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
::find_impl<unsigned_long>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
           *this,key_arg<unsigned_long> *key,size_t hashval,size_t *offset)

{
  char *pcVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  slot_type *psVar4;
  key_arg<unsigned_long> kVar5;
  uint uVar6;
  ushort uVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  bool bVar30;
  __m128i match;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  char cVar33;
  char cVar35;
  char cVar36;
  char cVar37;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar27 = hashval >> 7 & uVar2;
  pcVar3 = this->ctrl_;
  psVar4 = this->slots_;
  uVar24 = hashval & 0x7f;
  auVar31 = ZEXT216(CONCAT11((char)uVar24,(char)uVar24));
  auVar31 = pshuflw(auVar31,auVar31,0);
  lVar25 = 0;
  do {
    pcVar1 = pcVar3 + uVar27;
    cVar8 = *pcVar1;
    cVar9 = pcVar1[1];
    cVar10 = pcVar1[2];
    cVar11 = pcVar1[3];
    cVar12 = pcVar1[4];
    cVar13 = pcVar1[5];
    cVar14 = pcVar1[6];
    cVar15 = pcVar1[7];
    cVar16 = pcVar1[8];
    cVar17 = pcVar1[9];
    cVar18 = pcVar1[10];
    cVar19 = pcVar1[0xb];
    cVar20 = pcVar1[0xc];
    cVar21 = pcVar1[0xd];
    cVar22 = pcVar1[0xe];
    cVar23 = pcVar1[0xf];
    cVar33 = auVar31[0];
    auVar34[0] = -(cVar33 == cVar8);
    cVar35 = auVar31[1];
    auVar34[1] = -(cVar35 == cVar9);
    cVar36 = auVar31[2];
    auVar34[2] = -(cVar36 == cVar10);
    cVar37 = auVar31[3];
    auVar34[3] = -(cVar37 == cVar11);
    auVar34[4] = -(cVar33 == cVar12);
    auVar34[5] = -(cVar35 == cVar13);
    auVar34[6] = -(cVar36 == cVar14);
    auVar34[7] = -(cVar37 == cVar15);
    auVar34[8] = -(cVar33 == cVar16);
    auVar34[9] = -(cVar35 == cVar17);
    auVar34[10] = -(cVar36 == cVar18);
    auVar34[0xb] = -(cVar37 == cVar19);
    auVar34[0xc] = -(cVar33 == cVar20);
    auVar34[0xd] = -(cVar35 == cVar21);
    auVar34[0xe] = -(cVar36 == cVar22);
    auVar34[0xf] = -(cVar37 == cVar23);
    uVar7 = (ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe | (ushort)(auVar34[0xf] >> 7) << 0xf;
    bVar30 = uVar7 == 0;
    if (!bVar30) {
      uVar26 = (uint)uVar7;
      do {
        uVar6 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        uVar29 = uVar6 + uVar27 & uVar2;
        *offset = uVar29;
        kVar5 = psVar4[uVar29].value.first;
        uVar24 = (ulong)(byte)((byte)uVar24 | kVar5 == *key);
        if (kVar5 == *key) break;
        uVar26 = uVar26 - 1 & uVar26;
        bVar30 = uVar26 == 0;
      } while (!bVar30);
    }
    if (bVar30) {
      auVar32[0] = -(cVar8 == -0x80);
      auVar32[1] = -(cVar9 == -0x80);
      auVar32[2] = -(cVar10 == -0x80);
      auVar32[3] = -(cVar11 == -0x80);
      auVar32[4] = -(cVar12 == -0x80);
      auVar32[5] = -(cVar13 == -0x80);
      auVar32[6] = -(cVar14 == -0x80);
      auVar32[7] = -(cVar15 == -0x80);
      auVar32[8] = -(cVar16 == -0x80);
      auVar32[9] = -(cVar17 == -0x80);
      auVar32[10] = -(cVar18 == -0x80);
      auVar32[0xb] = -(cVar19 == -0x80);
      auVar32[0xc] = -(cVar20 == -0x80);
      auVar32[0xd] = -(cVar21 == -0x80);
      auVar32[0xe] = -(cVar22 == -0x80);
      auVar32[0xf] = -(cVar23 == -0x80);
      if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar32 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar32 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar32 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar32 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar32 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar32 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar32 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar32 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar32 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar32 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar32 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf])
      {
        lVar28 = uVar27 + lVar25;
        lVar25 = lVar25 + 0x10;
        uVar27 = lVar28 + 0x10U & uVar2;
        bVar30 = true;
      }
      else {
        bVar30 = false;
        uVar24 = 0;
      }
    }
    else {
      bVar30 = false;
    }
    if (!bVar30) {
      return (bool)((byte)uVar24 & 1);
    }
  } while( true );
}

Assistant:

probe_seq<Group::kWidth> probe(size_t hashval) const
			{
				return probe_seq<Group::kWidth>(H1(hashval, ctrl_), capacity_);
			}